

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPrivateKey.cpp
# Opt level: O2

bool __thiscall RSAPrivateKey::deserialise(RSAPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dE;
  ByteString dN;
  ByteString dD;
  ByteString dDQ1;
  ByteString dDP1;
  ByteString dPQ;
  ByteString dQ;
  ByteString dP;
  ByteString BStack_158;
  ByteString local_130;
  ByteString local_108;
  ByteString local_e0;
  ByteString local_b8;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  ByteString::chainDeserialise(&local_b8,serialised);
  ByteString::chainDeserialise(&local_e0,serialised);
  ByteString::chainDeserialise(&local_108,serialised);
  ByteString::chainDeserialise(&local_130,serialised);
  ByteString::chainDeserialise(&BStack_158,serialised);
  sVar1 = ByteString::size(&local_108);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_130);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&BStack_158);
      if (sVar1 != 0) {
        (**(code **)(*(long *)this + 0x40))(this,&local_40);
        (**(code **)(*(long *)this + 0x48))(this,&local_68);
        (**(code **)(*(long *)this + 0x50))(this,&local_90);
        (**(code **)(*(long *)this + 0x58))(this,&local_b8);
        (**(code **)(*(long *)this + 0x60))(this,&local_e0);
        (**(code **)(*(long *)this + 0x68))(this,&local_108);
        (**(code **)(*(long *)this + 0x70))(this,&local_130);
        bVar2 = true;
        (**(code **)(*(long *)this + 0x78))(this,&BStack_158);
        goto LAB_0014daee;
      }
    }
  }
  bVar2 = false;
LAB_0014daee:
  ByteString::~ByteString(&BStack_158);
  ByteString::~ByteString(&local_130);
  ByteString::~ByteString(&local_108);
  ByteString::~ByteString(&local_e0);
  ByteString::~ByteString(&local_b8);
  ByteString::~ByteString(&local_90);
  ByteString::~ByteString(&local_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool RSAPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dPQ = ByteString::chainDeserialise(serialised);
	ByteString dDP1 = ByteString::chainDeserialise(serialised);
	ByteString dDQ1 = ByteString::chainDeserialise(serialised);
	ByteString dD = ByteString::chainDeserialise(serialised);
	ByteString dN = ByteString::chainDeserialise(serialised);
	ByteString dE = ByteString::chainDeserialise(serialised);

	if ((dD.size() == 0) ||
	    (dN.size() == 0) ||
	    (dE.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setPQ(dPQ);
	setDP1(dDP1);
	setDQ1(dDQ1);
	setD(dD);
	setN(dN);
	setE(dE);

	return true;
}